

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::MergeReturnPass::CreateReturn(MergeReturnPass *this,BasicBlock *block)

{
  IRContext *pIVar1;
  uint32_t to;
  IntrusiveNodeBase<spvtools::opt::Instruction> *pIVar2;
  uint32_t from;
  Instruction *pIVar3;
  DecorationManager *this_00;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint32_t loadId;
  Op local_dc;
  uint local_d8;
  uint local_d4;
  IRContext *local_d0;
  Instruction *local_c8;
  IntrusiveNodeBase<spvtools::opt::Instruction> *local_c0;
  IntrusiveNodeBase<spvtools::opt::Instruction> *local_b8;
  IntrusiveNodeBase<spvtools::opt::Instruction> *local_b0;
  uint32_t local_a4;
  SmallVector<unsigned_int,_2UL> local_a0;
  Operand local_78;
  initializer_list<spvtools::opt::Operand> local_40;
  
  AddReturnValue(this);
  if (this->return_value_ == (Instruction *)0x0) {
    local_78._0_8_ = (this->super_MemPass).super_Pass.context_;
    local_a0._vptr_SmallVector._0_4_ = 0xfd;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op>
              ((spvtools *)&local_c0,(IRContext **)&local_78,(Op *)&local_a0);
    pIVar2 = local_c0;
    local_c0 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
              (pIVar2,&(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_);
    if (local_c0 != (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
    local_c0 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
  }
  else {
    loadId = Pass::TakeNextId((Pass *)this);
    local_d0 = (this->super_MemPass).super_Pass.context_;
    local_dc = OpLoad;
    local_d4 = opt::Function::type_id(this->function_);
    local_d8 = Instruction::result_id(this->return_value_);
    init_list._M_len = 1;
    init_list._M_array = &local_d8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,init_list);
    local_78.type = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_78.words,&local_a0);
    local_40._M_array = &local_78;
    local_40._M_len = 1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_b0,&local_d0,&local_dc,&local_d4,&loadId,&local_40);
    pIVar2 = local_b0;
    local_b0 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
    local_c8 = &(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(pIVar2,local_c8);
    if (local_b0 != (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
    local_b0 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_78.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
    pIVar3 = BasicBlock::terminator(block);
    IRContext::AnalyzeDefUse((this->super_MemPass).super_Pass.context_,pIVar3);
    IRContext::set_instr_block((this->super_MemPass).super_Pass.context_,pIVar3,block);
    this_00 = IRContext::get_decoration_mgr((this->super_MemPass).super_Pass.context_);
    from = Instruction::result_id(this->return_value_);
    to = loadId;
    local_a0._vptr_SmallVector._0_4_ = 0;
    local_78._0_8_ = (IRContext *)0x0;
    local_78.words._vptr_SmallVector = (_func_int **)0x0;
    local_78.words.size_ = 0;
    std::vector<spv::Decoration,std::allocator<spv::Decoration>>::
    _M_range_initialize<spv::Decoration_const*>
              ((vector<spv::Decoration,std::allocator<spv::Decoration>> *)&local_78,&local_a0,
               (undefined1 *)((long)&local_a0._vptr_SmallVector + 4));
    analysis::DecorationManager::CloneDecorations
              (this_00,from,to,
               (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)&local_78);
    std::_Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>::~_Vector_base
              ((_Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_> *)&local_78);
    local_d0 = (this->super_MemPass).super_Pass.context_;
    local_d4 = 0;
    local_d8 = 0;
    local_dc = OpReturnValue;
    local_a4 = loadId;
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_a4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,init_list_00);
    local_78.type = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_78.words,&local_a0);
    local_40._M_len = 1;
    local_40._M_array = &local_78;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_b8,&local_d0,&local_dc,(int *)&local_d4,(int *)&local_d8,&local_40
              );
    pIVar2 = local_b8;
    local_b8 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(pIVar2,local_c8);
    if (local_b8 != (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
    local_b8 = (IntrusiveNodeBase<spvtools::opt::Instruction> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_78.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
  }
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  pIVar3 = BasicBlock::terminator(block);
  IRContext::AnalyzeDefUse(pIVar1,pIVar3);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  pIVar3 = BasicBlock::terminator(block);
  IRContext::set_instr_block(pIVar1,pIVar3,block);
  return;
}

Assistant:

void MergeReturnPass::CreateReturn(BasicBlock* block) {
  AddReturnValue();

  if (return_value_) {
    // Load and return the final return value
    uint32_t loadId = TakeNextId();
    block->AddInstruction(MakeUnique<Instruction>(
        context(), spv::Op::OpLoad, function_->type_id(), loadId,
        std::initializer_list<Operand>{
            {SPV_OPERAND_TYPE_ID, {return_value_->result_id()}}}));
    Instruction* var_inst = block->terminator();
    context()->AnalyzeDefUse(var_inst);
    context()->set_instr_block(var_inst, block);
    context()->get_decoration_mgr()->CloneDecorations(
        return_value_->result_id(), loadId,
        {spv::Decoration::RelaxedPrecision});

    block->AddInstruction(MakeUnique<Instruction>(
        context(), spv::Op::OpReturnValue, 0, 0,
        std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {loadId}}}));
    context()->AnalyzeDefUse(block->terminator());
    context()->set_instr_block(block->terminator(), block);
  } else {
    block->AddInstruction(
        MakeUnique<Instruction>(context(), spv::Op::OpReturn));
    context()->AnalyzeDefUse(block->terminator());
    context()->set_instr_block(block->terminator(), block);
  }
}